

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntWeakPtr<Diligent::IRenderDevice> * __thiscall
Diligent::RefCntWeakPtr<Diligent::IRenderDevice>::operator=
          (RefCntWeakPtr<Diligent::IRenderDevice> *this,IRenderDevice *pObj)

{
  RefCntWeakPtr<Diligent::IRenderDevice> local_28;
  
  RefCntWeakPtr(&local_28,pObj);
  if (this->m_pRefCounters != local_28.m_pRefCounters) {
    Release(this);
    this->m_pObject = local_28.m_pObject;
    this->m_pRefCounters = local_28.m_pRefCounters;
    local_28.m_pRefCounters = (RefCountersImpl *)0x0;
    local_28.m_pObject = (IRenderDevice *)0x0;
  }
  Release(&local_28);
  return this;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }